

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

string * __thiscall
choc::html::HTMLElement::escapeHTMLString_abi_cxx11_
          (string *__return_storage_ptr__,HTMLElement *this,string_view text,bool escapeNewLines)

{
  bool bVar1;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint local_48;
  char local_41;
  uint32_t unicodeChar;
  value_type character;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  undefined1 auStack_20 [7];
  bool escapeNewLines_local;
  string_view text_local;
  string *result;
  
  text_local._M_len = text._M_len;
  __range2._7_1_ = (byte)text._M_str & 1;
  __range2._6_1_ = 0;
  _auStack_20 = this;
  text_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __begin2 = auStack_20;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  _unicodeChar = std::basic_string_view<char,_std::char_traits<char>_>::end
                           ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  for (; __end2 != _unicodeChar; __end2 = __end2 + 1) {
    local_41 = *__end2;
    local_48 = (uint)local_41;
    bVar1 = isCharLegal(local_48);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_41);
    }
    else {
      switch(local_48) {
      case 0x22:
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&quot;");
        break;
      default:
        if (((__range2._7_1_ & 1) == 0) && ((local_48 == 10 || (local_48 == 0xd)))) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_41);
        }
        else {
          std::__cxx11::to_string(&local_b8,local_48);
          std::operator+(&local_98,"&#",&local_b8);
          std::operator+(&local_78,&local_98,';');
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        break;
      case 0x26:
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&amp;");
        break;
      case 0x3c:
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&lt;");
        break;
      case 0x3e:
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&gt;");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string escapeHTMLString (std::string_view text, bool escapeNewLines)
    {
        std::string result;

        for (auto character : text)
        {
            auto unicodeChar = static_cast<uint32_t> (character);

            if (isCharLegal (unicodeChar))
            {
                result += character;
            }
            else
            {
                switch (unicodeChar)
                {
                    case '<':   result += "&lt;";   break;
                    case '>':   result += "&gt;";   break;
                    case '&':   result += "&amp;";  break;
                    case '"':   result += "&quot;"; break;

                    default:
                        if (! escapeNewLines && (unicodeChar == '\n' || unicodeChar == '\r'))
                            result += character;
                        else
                            result += "&#" + std::to_string (unicodeChar) + ';';

                        break;
                }
            }
        }

        return result;
    }